

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O0

void printRoundingControl(MCInst *MI,uint Op,SStream *O)

{
  MCOperand *op;
  int64_t iVar1;
  int64_t Imm;
  SStream *O_local;
  uint Op_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,Op);
  iVar1 = MCOperand_getImm(op);
  switch((uint)iVar1 & 3) {
  case 0:
    SStream_concat0(O,"{rn-sae}");
    op_addAvxSae(MI);
    op_addAvxRoundingMode(MI,1);
    break;
  case 1:
    SStream_concat0(O,"{rd-sae}");
    op_addAvxSae(MI);
    op_addAvxRoundingMode(MI,2);
    break;
  case 2:
    SStream_concat0(O,"{ru-sae}");
    op_addAvxSae(MI);
    op_addAvxRoundingMode(MI,3);
    break;
  case 3:
    SStream_concat0(O,"{rz-sae}");
    op_addAvxSae(MI);
    op_addAvxRoundingMode(MI,4);
  }
  return;
}

Assistant:

static void printRoundingControl(MCInst *MI, unsigned Op, SStream *O)
{
	int64_t Imm = MCOperand_getImm(MCInst_getOperand(MI, Op)) & 0x3;
	switch (Imm) {
		case 0: SStream_concat0(O, "{rn-sae}"); op_addAvxSae(MI); op_addAvxRoundingMode(MI, X86_AVX_RM_RN); break;
		case 1: SStream_concat0(O, "{rd-sae}"); op_addAvxSae(MI); op_addAvxRoundingMode(MI, X86_AVX_RM_RD); break;
		case 2: SStream_concat0(O, "{ru-sae}"); op_addAvxSae(MI); op_addAvxRoundingMode(MI, X86_AVX_RM_RU); break;
		case 3: SStream_concat0(O, "{rz-sae}"); op_addAvxSae(MI); op_addAvxRoundingMode(MI, X86_AVX_RM_RZ); break;
		default: break;	// nev0er reach
	}
}